

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O0

bool google::protobuf::internal::GetAnyFieldDescriptors
               (Message *message,FieldDescriptor **type_url_field,FieldDescriptor **value_field)

{
  bool bVar1;
  Type TVar2;
  Descriptor *this;
  FieldDescriptor *pFVar3;
  FieldDescriptor *in_RDX;
  long *in_RSI;
  Descriptor *descriptor;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  bool local_1;
  
  this = Message::GetDescriptor
                   ((Message *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  Descriptor::full_name_abi_cxx11_(this);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
  if (bVar1) {
    local_1 = false;
  }
  else {
    pFVar3 = Descriptor::FindFieldByNumber(this,in_stack_ffffffffffffffd4);
    *in_RSI = (long)pFVar3;
    pFVar3 = Descriptor::FindFieldByNumber(this,in_stack_ffffffffffffffd4);
    *(FieldDescriptor **)in_RDX = pFVar3;
    local_1 = false;
    if (*in_RSI != 0) {
      TVar2 = FieldDescriptor::type(in_RDX);
      local_1 = false;
      if ((TVar2 == TYPE_STRING) && (local_1 = false, *(long *)in_RDX != 0)) {
        TVar2 = FieldDescriptor::type(in_RDX);
        local_1 = TVar2 == TYPE_BYTES;
      }
    }
  }
  return local_1;
}

Assistant:

bool GetAnyFieldDescriptors(const Message& message,
                            const FieldDescriptor** type_url_field,
                            const FieldDescriptor** value_field) {
  const Descriptor* descriptor = message.GetDescriptor();
  if (descriptor->full_name() != kAnyFullTypeName) {
    return false;
  }
  *type_url_field = descriptor->FindFieldByNumber(1);
  *value_field = descriptor->FindFieldByNumber(2);
  return (*type_url_field != NULL &&
          (*type_url_field)->type() == FieldDescriptor::TYPE_STRING &&
          *value_field != NULL &&
          (*value_field)->type() == FieldDescriptor::TYPE_BYTES);
}